

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O0

shared_ptr<binlog::Session::Channel> __thiscall
binlog::Session::createChannel(Session *this,size_t queueCapacity,WriterProp *writerProp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<binlog::Session::Channel> sVar1;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  element_type *this_00;
  WriterProp *in_stack_ffffffffffffffb8;
  unsigned_long *in_stack_ffffffffffffffc0;
  Session *in_stack_ffffffffffffffc8;
  
  this_00 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffff88);
  std::make_shared<binlog::Session::Channel,binlog::Session&,unsigned_long&,binlog::WriterProp>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::push_back((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
               *)this_00,(value_type *)in_stack_ffffffffffffff88);
  std::shared_ptr<binlog::Session::Channel>::~shared_ptr
            ((shared_ptr<binlog::Session::Channel> *)0x1070c0);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::back((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
          *)this_00);
  std::shared_ptr<binlog::Session::Channel>::shared_ptr
            ((shared_ptr<binlog::Session::Channel> *)this_00,
             (shared_ptr<binlog::Session::Channel> *)in_stack_ffffffffffffff88);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1070e5);
  sVar1.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<binlog::Session::Channel>)
         sVar1.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Session::Channel> Session::createChannel(std::size_t queueCapacity, WriterProp writerProp)
{
  std::lock_guard<std::mutex> lock(_mutex);

  _channels.push_back(std::make_shared<Channel>(*this, queueCapacity, std::move(writerProp)));
  return _channels.back();
}